

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O3

void mqtt_easy_dtor(void *key,size_t klen,void *entry)

{
  Curl_dyn_free((dynbuf *)entry);
  Curl_dyn_free((dynbuf *)((long)entry + 0x20));
  (*Curl_cfree)(entry);
  return;
}

Assistant:

static void mqtt_easy_dtor(void *key, size_t klen, void *entry)
{
  struct MQTT *mq = entry;
  (void)key;
  (void)klen;
  Curl_dyn_free(&mq->sendbuf);
  Curl_dyn_free(&mq->recvbuf);
  free(mq);
}